

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpcmStreamReader.cpp
# Opt level: O1

int __thiscall LPCMStreamReader::decodeLPCMHeader(LPCMStreamReader *this,uint8_t *buff)

{
  byte bVar1;
  uint16_t uVar2;
  
  uVar2 = AV_RB16(buff);
  bVar1 = buff[2];
  this->m_lfeExists = false;
  switch(bVar1 >> 4) {
  case 0:
  case 1:
    this->m_channels = '\x01';
    break;
  case 2:
  case 3:
    this->m_channels = '\x02';
    break;
  case 4:
    this->m_channels = '\x03';
    break;
  case 5:
    this->m_channels = '\x03';
    this->m_lfeExists = true;
    break;
  case 6:
    this->m_channels = '\x04';
    this->m_lfeExists = true;
    break;
  case 7:
    this->m_channels = '\x04';
    break;
  case 8:
    this->m_channels = '\x05';
    break;
  case 9:
    this->m_channels = '\x06';
    this->m_lfeExists = true;
    break;
  case 10:
    this->m_channels = '\a';
    break;
  case 0xb:
    this->m_channels = '\b';
    this->m_lfeExists = true;
  }
  this->m_freq = m2tsFreqs[buff[2] & 0xf];
  if (0x3f < buff[3]) {
    this->m_bitsPerSample = (ushort)(buff[3] >> 6) * 4 + 0xc;
  }
  return (int)uVar2;
}

Assistant:

int LPCMStreamReader::decodeLPCMHeader(const uint8_t* buff)
{
    const int audio_data_payload_size = AV_RB16(buff);
    const int channelsIndex = buff[2] >> 4;
    m_lfeExists = false;
    switch (channelsIndex)
    {
    case 0:
    case 1:
        m_channels = 1;
        break;
    case 2:
    case 3:
        m_channels = 2;
        break;
    case 4:
        m_channels = 3;
        break;
    case 5:
        m_channels = 3;
        m_lfeExists = true;
        break;
    case 6:
        m_channels = 4;
        m_lfeExists = true;
        break;
    case 7:
        m_channels = 4;
        break;
    case 8:
        m_channels = 5;
        break;
    case 9:
        m_channels = 6;
        m_lfeExists = true;
        break;
    case 10:
        m_channels = 7;
        break;
    case 11:
        m_channels = 8;
        m_lfeExists = true;
        break;
    default:;
    }
    const int sampling_index = buff[2] & 0x0f;
    m_freq = m2tsFreqs[sampling_index];
    const uint8_t bits_per_sample = buff[3] >> 6;
    if (bits_per_sample > 0)
        m_bitsPerSample = static_cast<uint16_t>(12 + 4 * bits_per_sample);
    return audio_data_payload_size;
}